

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O0

ElementsNetType
cfd::js::api::ElementsAddressStructApi::ConvertElementsNetType(string *elements_net_type)

{
  bool bVar1;
  CfdException *this;
  allocator local_51;
  string local_50 [32];
  CfdSourceLocation local_30;
  ElementsNetType local_14;
  string *psStack_10;
  ElementsNetType net_type;
  string *elements_net_type_local;
  
  psStack_10 = elements_net_type;
  bVar1 = std::operator==(elements_net_type,"liquidv1");
  if (bVar1) {
    local_14 = kLiquidV1;
  }
  else {
    bVar1 = std::operator==(psStack_10,"regtest");
    if (!bVar1) {
      bVar1 = std::operator==(psStack_10,"liquidregtest");
      if (!bVar1) {
        bVar1 = std::operator==(psStack_10,"elementsregtest");
        if (!bVar1) {
          local_30.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp"
                       ,0x2f);
          local_30.filename = local_30.filename + 1;
          local_30.line = 0x160;
          local_30.funcname = "ConvertElementsNetType";
          core::logger::warn<std::__cxx11::string_const&>
                    (&local_30,
                     "Failed to ConvertElementsNetType. Invalid elements_network_type passed:  elements_network_type={}"
                     ,psStack_10);
          this = (CfdException *)__cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_50,
                     "Invalid elements_network_type passed. elements_network_type must be \"liquidv1\" or \"liquidregtest\" or \"elementsregtest\" or \"regtest\"."
                     ,&local_51);
          core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
          __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
    }
    local_14 = kElementsRegtest;
  }
  return local_14;
}

Assistant:

ElementsNetType ElementsAddressStructApi::ConvertElementsNetType(
    const std::string& elements_net_type) {
  ElementsNetType net_type;
  if (elements_net_type == "liquidv1") {
    net_type = ElementsNetType::kLiquidV1;
  } else if (
      (elements_net_type == "regtest") ||
      (elements_net_type == "liquidregtest") ||
      (elements_net_type == "elementsregtest")) {
    net_type = ElementsNetType::kElementsRegtest;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ConvertElementsNetType. Invalid elements_network_type "
        "passed:  elements_network_type={}",  // NOLINT
        elements_net_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid elements_network_type passed. elements_network_type must be "
        "\"liquidv1\" or \"liquidregtest\" or \"elementsregtest\" "
        "or \"regtest\".");  // NOLINT
  }
  return net_type;
}